

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O1

Aig_Obj_t * createConstrained0LiveConeWithDSC(Aig_Man_t *pNewAig,Vec_Ptr_t *signalList)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  
  iVar1 = signalList->nSize;
  if (0 < iVar1) {
    pAVar5 = pNewAig->pConst1;
    pvVar2 = signalList->pArray[iVar1 - 1];
    uVar3 = *(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x28);
    if (iVar1 != 1) {
      uVar6 = 0;
      do {
        if ((long)signalList->nSize <= (long)uVar6) goto LAB_005b1c0d;
        uVar4 = *(ulong *)(((ulong)signalList->pArray[uVar6] & 0xfffffffffffffffe) + 0x28);
        if (uVar4 == 0) {
          __assert_fail("Aig_Regular(pObj)->pData",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                        ,0xe2,
                        "Aig_Obj_t *createConstrained0LiveConeWithDSC(Aig_Man_t *, Vec_Ptr_t *)");
        }
        pAVar5 = Aig_And(pNewAig,pAVar5,(Aig_Obj_t *)((uint)signalList->pArray[uVar6] & 1 ^ uVar4));
        uVar6 = uVar6 + 1;
      } while (iVar1 - 1 != uVar6);
    }
    pAVar5 = Aig_Or(pNewAig,(Aig_Obj_t *)((ulong)pAVar5 ^ 1),(Aig_Obj_t *)((uint)pvVar2 & 1 ^ uVar3)
                   );
    return pAVar5;
  }
LAB_005b1c0d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Obj_t *createConstrained0LiveConeWithDSC( Aig_Man_t *pNewAig, Vec_Ptr_t *signalList )
{
	Aig_Obj_t *pConsequent, *pConsequentCopy, *pAntecedent, *p0LiveCone, *pObj;
	int i, numSigAntecedent;
	
	numSigAntecedent = Vec_PtrSize( signalList ) - 1;

	pAntecedent = Aig_ManConst1( pNewAig );
	pConsequent = (Aig_Obj_t *)Vec_PtrEntry( signalList, numSigAntecedent );
	pConsequentCopy = Aig_NotCond( (Aig_Obj_t *)(Aig_Regular(pConsequent)->pData), Aig_IsComplement( pConsequent ) );

	for(i=0; i<numSigAntecedent; i++ )
	{
		pObj = (Aig_Obj_t *)Vec_PtrEntry( signalList, i );
		assert( Aig_Regular(pObj)->pData );
		pAntecedent = Aig_And( pNewAig, pAntecedent, Aig_NotCond((Aig_Obj_t *)(Aig_Regular(pObj)->pData), Aig_IsComplement(pObj)) );
	}

	p0LiveCone = Aig_Or( pNewAig, Aig_Not(pAntecedent), pConsequentCopy );

	return p0LiveCone;
}